

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_pool32axf_nanomips_insn(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  TCGContext_conflict6 *s;
  TCGv_ptr pTVar1;
  TCGContext_conflict6 *s_00;
  uint uVar2;
  TCGTemp *pTVar3;
  TCGTemp *pTVar4;
  TCGTemp *pTVar5;
  TCGv_i64 pTVar6;
  int iVar7;
  uintptr_t o;
  TCGv_i64 pTVar8;
  uint uVar9;
  uint32_t uVar10;
  uintptr_t o_48;
  uintptr_t o_89;
  uintptr_t o_18;
  TCGv_i64 pTVar11;
  TCGOpcode TVar12;
  code *pcVar13;
  uint from;
  uintptr_t o_27;
  ulong uVar14;
  uintptr_t o_3;
  uint to;
  uintptr_t o_28;
  TCGv_i64 pTVar15;
  uint uVar16;
  uintptr_t o_1;
  TCGv_i64 pTVar17;
  TCGTemp *args [1];
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGv_ptr local_50;
  uint local_3c;
  DisasContext_conflict6 *local_38;
  ulong a2;
  
  uVar16 = ctx->opcode;
  uVar2 = uVar16 >> 6 & 7;
  if (6 < uVar2 - 1) {
switchD_0099b8b0_caseD_3:
    generate_exception_err(ctx,0x14,0);
    return;
  }
  s = ctx->uc->tcg_ctx;
  to = uVar16 >> 0x15 & 0x1f;
  from = uVar16 >> 0x10 & 0x1f;
  a2 = (ulong)from;
  uVar9 = uVar16 >> 0xb & 0x1f;
  switch(uVar2) {
  case 1:
    pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar5 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar11 = (TCGv_i64)((long)pTVar3 - (long)s);
    if (from == 0) {
      TVar12 = INDEX_op_movi_i64;
      pTVar8 = (TCGv_i64)0x0;
LAB_0099bc62:
      tcg_gen_op2_mips64el(s,TVar12,(TCGArg)pTVar3,(TCGArg)pTVar8);
    }
    else if (s->cpu_gpr[a2] != pTVar11) {
      pTVar8 = s->cpu_gpr[a2] + (long)s;
      TVar12 = INDEX_op_mov_i64;
      goto LAB_0099bc62;
    }
    break;
  case 2:
    local_3c = uVar16 >> 0xc & 3;
    local_38 = ctx;
    tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar5 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    if (to == 0) {
      TVar12 = INDEX_op_movi_i64;
      pTVar11 = (TCGv_i64)0x0;
    }
    else {
      if (s->cpu_gpr[to] == (TCGv_i64)((long)pTVar4 - (long)s)) goto LAB_0099bcf4;
      pTVar11 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[to]);
      TVar12 = INDEX_op_mov_i64;
    }
    tcg_gen_op2_mips64el(s,TVar12,(TCGArg)pTVar4,(TCGArg)pTVar11);
LAB_0099bcf4:
    uVar14 = (ulong)local_3c;
    if (from != 0) {
      if (s->cpu_gpr[a2] != (TCGv_i64)((long)pTVar5 - (long)s)) {
        tcg_gen_op2_mips64el
                  (s,INDEX_op_mov_i64,(TCGArg)pTVar5,
                   (TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[a2]));
      }
      (*(code *)(&DAT_00da8414 + *(int *)(&DAT_00da8414 + uVar14 * 4)))();
      return;
    }
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar5,0);
    (*(code *)(&DAT_00da8414 + *(int *)(&DAT_00da8414 + uVar14 * 4)))();
    return;
  default:
    goto switchD_0099b8b0_caseD_3;
  case 4:
    uVar16 = uVar16 >> 9 & 0x7f;
    pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar5 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar8 = (TCGv_i64)((long)pTVar5 - (long)s);
    if (from == 0) {
      TVar12 = INDEX_op_movi_i64;
      pTVar11 = (TCGv_i64)0x0;
LAB_0099bb49:
      tcg_gen_op2_mips64el(s,TVar12,(TCGArg)pTVar5,(TCGArg)pTVar11);
    }
    else if (s->cpu_gpr[from] != pTVar8) {
      pTVar11 = s->cpu_gpr[from] + (long)s;
      TVar12 = INDEX_op_mov_i64;
      goto LAB_0099bb49;
    }
    pTVar11 = (TCGv_i64)((long)pTVar4 - (long)s);
    if (0x2f < uVar16) {
      if (uVar16 < 0x49) {
        if (0x38 < uVar16) {
          if (uVar16 != 0x39) {
            if (uVar16 == 0x3d) {
              gen_bshfl(ctx,0x7c0000a0,to,from);
              goto LAB_0099ce4f;
            }
            if (uVar16 == 0x48) {
              if ((ctx->hflags & 0x80000) == 0) {
                gen_pool32axf_nanomips_insn_cold_15();
              }
              pcVar13 = helper_precequ_ph_qbr_mips64el;
              goto LAB_0099c4ec;
            }
switchD_0099bfde_caseD_2:
            generate_exception_err(ctx,0x14,0);
            goto LAB_0099ce4f;
          }
          if ((ctx->hflags & 0x80000) == 0) {
            gen_pool32axf_nanomips_insn_cold_14();
          }
          pcVar13 = helper_precequ_ph_qbla_mips64el;
          goto LAB_0099ca76;
        }
        if (uVar16 == 0x30) {
          if ((ctx->hflags & 0x80000) == 0) {
            gen_pool32axf_nanomips_insn_cold_17();
          }
          tcg_gen_andi_i64_mips64el(s,pTVar8,pTVar8,0xffff);
          tcg_gen_shli_i64_mips64el(s,pTVar8,pTVar8,0x10);
LAB_0099c998:
          tcg_gen_ext32s_i64_mips64el(s,pTVar8,pTVar8);
          goto LAB_0099ca83;
        }
        if (uVar16 != 0x38) goto switchD_0099bfde_caseD_2;
        if ((ctx->hflags & 0x80000) == 0) {
          gen_pool32axf_nanomips_insn_cold_16();
        }
        pcVar13 = helper_precequ_ph_qbl_mips64el;
LAB_0099c4ec:
        iVar7 = 1;
        goto LAB_0099c822;
      }
      if (uVar16 < 0x68) {
        if (uVar16 == 0x49) {
          if ((ctx->hflags & 0x80000) == 0) {
            gen_pool32axf_nanomips_insn_cold_13();
          }
          pcVar13 = helper_precequ_ph_qbra_mips64el;
        }
        else {
          if (uVar16 != 0x58) {
            if (uVar16 == 0x59) {
              if ((ctx->hflags & 0x80000) == 0) {
                gen_pool32axf_nanomips_insn_cold_10();
              }
              pcVar13 = helper_preceu_ph_qbla_mips64el;
              goto LAB_0099c4ec;
            }
            goto switchD_0099bfde_caseD_2;
          }
          if ((ctx->hflags & 0x80000) == 0) {
            gen_pool32axf_nanomips_insn_cold_12();
          }
          pcVar13 = helper_preceu_ph_qbl_mips64el;
        }
      }
      else if (uVar16 == 0x68) {
        if ((ctx->hflags & 0x80000) == 0) {
          gen_pool32axf_nanomips_insn_cold_11();
        }
        pcVar13 = helper_preceu_ph_qbr_mips64el;
      }
      else {
        if (uVar16 != 0x69) {
          if (uVar16 == 0x78) {
            if ((ctx->hflags & 0x80000) == 0) {
              gen_pool32axf_nanomips_insn_cold_4();
            }
            pcVar13 = helper_raddu_w_qb_mips64el;
            goto LAB_0099c4ec;
          }
          goto switchD_0099bfde_caseD_2;
        }
        if ((ctx->hflags & 0x80000) == 0) {
          gen_pool32axf_nanomips_insn_cold_9();
        }
        pcVar13 = helper_preceu_ph_qbra_mips64el;
      }
LAB_0099ca76:
      iVar7 = 1;
LAB_0099ca7e:
      local_68 = (TCGTemp *)((long)s + (long)pTVar8);
      tcg_gen_callN_mips64el(s,pcVar13,local_68,iVar7,&local_68);
LAB_0099ca83:
      if (to == 0) goto LAB_0099ce4f;
      goto LAB_0099ca8b;
    }
    if (0xf < uVar16) {
      if (uVar16 < 0x25) {
        if (uVar16 != 0x10) {
          if (uVar16 == 0x18) {
            if ((ctx->hflags & 0x80000) == 0) {
              gen_pool32axf_nanomips_insn_cold_6();
            }
            pcVar13 = helper_bitrev_mips64el;
            goto LAB_0099ca76;
          }
          if (uVar16 != 0x20) goto switchD_0099bfde_caseD_2;
          if ((ctx->hflags & 0x80000) == 0) {
            gen_pool32axf_nanomips_insn_cold_5();
          }
          pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
          if (to == 0) {
            tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,0);
          }
          else if (s->cpu_gpr[to] != (TCGv_i64)((long)pTVar4 - (long)s)) {
            tcg_gen_op2_mips64el
                      (s,INDEX_op_mov_i64,(TCGArg)pTVar4,
                       (TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[to]));
          }
          local_68 = (TCGTemp *)(s->cpu_env + (long)s);
          local_60 = (TCGTemp *)((long)s + (long)pTVar8);
          pTVar4 = (TCGTemp *)((TCGv_i64)((long)pTVar4 - (long)s) + (long)s);
          local_58 = pTVar4;
          tcg_gen_callN_mips64el(s,helper_insv_mips64el,local_60,3,&local_68);
          if ((to != 0) && (s->cpu_gpr[to] != pTVar8)) {
            tcg_gen_op2_mips64el
                      (s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[to] + (long)s),(TCGArg)pTVar5);
          }
          tcg_temp_free_internal_mips64el(s,pTVar4);
          goto LAB_0099ce4f;
        }
        if ((ctx->hflags & 0x80000) == 0) {
          gen_pool32axf_nanomips_insn_cold_19();
        }
        local_60 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar13 = helper_absq_s_w_mips64el;
        iVar7 = 2;
        goto LAB_0099ca7e;
      }
      if (uVar16 == 0x25) {
        if ((ctx->CP0_Config5 & 0x200000) != 0) {
          generate_exception_err(ctx,0x14,0);
        }
        uVar10 = 0x70000021;
      }
      else {
        if (uVar16 == 0x28) {
          if ((ctx->hflags & 0x80000) == 0) {
            gen_pool32axf_nanomips_insn_cold_18();
          }
          tcg_gen_andi_i64_mips64el(s,pTVar8,pTVar8,0xffff0000);
          goto LAB_0099c998;
        }
        if (uVar16 != 0x2d) goto switchD_0099bfde_caseD_2;
        if ((ctx->CP0_Config5 & 0x200000) != 0) {
          generate_exception_err(ctx,0x14,0);
        }
        uVar10 = 0x70000020;
      }
      gen_cl(ctx,uVar10,to,from);
      goto LAB_0099ce4f;
    }
    switch(uVar16) {
    case 0:
      if ((ctx->hflags & 0x100000) == 0) {
        gen_pool32axf_nanomips_insn_cold_21();
      }
      pTVar1 = s->cpu_env;
      pcVar13 = helper_absq_s_qb_mips64el;
      break;
    case 1:
      if ((ctx->hflags & 0x80000) == 0) {
        gen_pool32axf_nanomips_insn_cold_8();
      }
      tcg_gen_ext16u_i64_mips64el(s,pTVar8,pTVar8);
      tcg_gen_shli_i64_mips64el(s,pTVar11,pTVar8,0x10);
      goto LAB_0099c883;
    default:
      goto switchD_0099bfde_caseD_2;
    case 5:
      gen_bitswap(ctx,0x7c000020,to,from);
      goto LAB_0099ce4f;
    case 8:
      if ((ctx->hflags & 0x80000) == 0) {
        gen_pool32axf_nanomips_insn_cold_20();
      }
      pTVar1 = s->cpu_env;
      pcVar13 = helper_absq_s_ph_mips64el;
      break;
    case 9:
      if ((ctx->hflags & 0x80000) == 0) {
        gen_pool32axf_nanomips_insn_cold_7();
      }
      tcg_gen_ext8u_i64_mips64el(s,pTVar8,pTVar8);
      tcg_gen_shli_i64_mips64el(s,pTVar11,pTVar8,8);
      tcg_gen_op3_mips64el(s,INDEX_op_or_i64,(TCGArg)pTVar5,(TCGArg)pTVar5,(TCGArg)pTVar4);
      tcg_gen_shli_i64_mips64el(s,pTVar11,pTVar8,0x10);
LAB_0099c883:
      tcg_gen_op3_mips64el(s,INDEX_op_or_i64,(TCGArg)pTVar5,(TCGArg)pTVar5,(TCGArg)pTVar4);
      tcg_gen_ext32s_i64_mips64el(s,pTVar8,pTVar8);
      goto LAB_0099c899;
    }
    local_60 = (TCGTemp *)(pTVar1 + (long)s);
    iVar7 = 2;
LAB_0099c822:
    local_68 = (TCGTemp *)((long)s + (long)pTVar8);
    tcg_gen_callN_mips64el(s,pcVar13,local_68,iVar7,&local_68);
LAB_0099c899:
    if (to != 0) {
LAB_0099ca8b:
      if (s->cpu_gpr[to] != pTVar8) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[to] + (long)s),(TCGArg)pTVar5);
      }
    }
    goto LAB_0099ce4f;
  case 5:
    uVar16 = uVar16 >> 9 & 0x7f;
    if (0x2a < uVar16) {
      switch(uVar16) {
      case 0x70:
        gen_load_srsgpr(s,from,to);
        return;
      case 0x71:
        uVar10 = 0x4200001f;
        break;
      case 0x72:
      case 0x73:
      case 0x74:
      case 0x75:
      case 0x76:
      case 0x77:
        goto switchD_0099b8b0_caseD_3;
      case 0x78:
        gen_store_srsgpr(s,from,to);
        return;
      case 0x79:
        uVar10 = 0x42000018;
        break;
      default:
        if (uVar16 != 0x2b) {
          if (uVar16 == 0x61) {
            uVar10 = 0x42000020;
            break;
          }
          goto switchD_0099b8b0_caseD_3;
        }
        if ((ctx->hflags & 0x10) == 0) {
          generate_exception_err(ctx,0x13,0);
        }
        pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
        save_cpu_state(ctx,1);
        pTVar1 = s->cpu_env;
        pcVar13 = helper_ei_mips64el;
        goto LAB_0099c5ee;
      }
LAB_0099c552:
      gen_cp0(env,ctx,uVar10,0,0);
      return;
    }
    if (uVar16 < 0xb) {
      if (uVar16 == 1) {
        uVar10 = 0x42000008;
      }
      else if (uVar16 == 3) {
        uVar10 = 0x42000003;
      }
      else {
        if (uVar16 != 9) goto switchD_0099b8b0_caseD_3;
        uVar10 = 0x42000001;
      }
      goto LAB_0099c552;
    }
    if (uVar16 < 0x19) {
      if (uVar16 == 0xb) {
        uVar10 = 0x42000004;
      }
      else {
        if (uVar16 != 0x11) goto switchD_0099b8b0_caseD_3;
        uVar10 = 0x42000002;
      }
      goto LAB_0099c552;
    }
    if (uVar16 == 0x19) {
      uVar10 = 0x42000006;
      goto LAB_0099c552;
    }
    if (uVar16 != 0x23) goto switchD_0099b8b0_caseD_3;
    if ((ctx->hflags & 0x10) == 0) {
      generate_exception_err(ctx,0x13,0);
    }
    pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    save_cpu_state(ctx,1);
    pTVar1 = s->cpu_env;
    pcVar13 = helper_di_mips64el;
LAB_0099c5ee:
    local_68 = (TCGTemp *)(pTVar1 + (long)s);
    tcg_gen_callN_mips64el(s,pcVar13,pTVar4,1,&local_68);
    if ((to != 0) && (s->cpu_gpr[to] != (TCGv_i64)((long)pTVar4 - (long)s))) {
      tcg_gen_op2_mips64el
                (s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[to]),
                 (TCGArg)pTVar4);
    }
    (ctx->base).is_jmp = DISAS_TARGET_0;
    goto LAB_0099daa4;
  case 7:
    uVar16 = uVar16 >> 9 & 7;
    pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar5 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar11 = (TCGv_i64)((long)pTVar5 - (long)s);
    if (from == 0) {
      TVar12 = INDEX_op_movi_i64;
      pTVar8 = (TCGv_i64)0x0;
LAB_0099bdd0:
      tcg_gen_op2_mips64el(s,TVar12,(TCGArg)pTVar5,(TCGArg)pTVar8);
    }
    else if (s->cpu_gpr[a2] != pTVar11) {
      pTVar8 = s->cpu_gpr[a2] + (long)s;
      TVar12 = INDEX_op_mov_i64;
      goto LAB_0099bdd0;
    }
    pTVar8 = (TCGv_i64)((long)pTVar4 - (long)s);
    if (uVar16 == 2) {
      if ((ctx->hflags & 0x80000) == 0) {
        gen_pool32axf_nanomips_insn_cold_1();
      }
      uVar16 = ctx->opcode >> 0xd;
      uVar2 = uVar16 & 0xff;
      tcg_gen_op2_mips64el
                (s,INDEX_op_movi_i64,(TCGArg)pTVar4,
                 (long)(int)(uVar2 << 8 | uVar16 << 0x18 | uVar2 << 0x10 | uVar2));
LAB_0099c473:
      if ((to != 0) && (s->cpu_gpr[to] != pTVar8)) {
        tcg_gen_op2_mips64el
                  (s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[to]),
                   (TCGArg)pTVar4);
      }
    }
    else {
      if (uVar16 == 1) {
        if ((ctx->hflags & 0x100000) == 0) {
          gen_pool32axf_nanomips_insn_cold_2();
        }
        tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,(ulong)(uVar9 >> 1));
        pcVar13 = helper_shrl_ph_mips64el;
LAB_0099c469:
        local_60 = (TCGTemp *)((long)s + (long)pTVar11);
        local_68 = (TCGTemp *)((long)s + (long)pTVar8);
        tcg_gen_callN_mips64el(s,pcVar13,local_68,2,&local_68);
        goto LAB_0099c473;
      }
      if (uVar16 == 0) {
        if ((ctx->hflags & 0x100000) == 0) {
          gen_pool32axf_nanomips_insn_cold_3();
        }
        tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,(ulong)(uVar9 >> 2));
        if ((ctx->opcode & 0x1000) == 0) {
          pcVar13 = helper_shra_qb_mips64el;
        }
        else {
          pcVar13 = helper_shra_r_qb_mips64el;
        }
        goto LAB_0099c469;
      }
      generate_exception_err(ctx,0x14,0);
    }
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar8 + (long)s));
    goto LAB_0099ce5a;
  }
  pTVar6 = (TCGv_i64)((long)pTVar4 - (long)s);
  pTVar8 = (TCGv_i64)((long)pTVar5 - (long)s);
  switch(uVar16 >> 9 & 7) {
  case 0:
    if ((ctx->hflags & 0x80000) == 0) {
      gen_pool32axf_nanomips_insn_cold_43();
    }
    switch(ctx->opcode >> 0xc & 3) {
    case 0:
      uVar10 = 0x10;
      break;
    case 1:
      uVar10 = 0x12;
      break;
    case 2:
      uVar10 = 0x11;
      to = from;
      break;
    case 3:
      uVar10 = 0x13;
      to = from;
    }
    gen_HILO(ctx,uVar10,uVar9 >> 3,to);
    break;
  case 1:
    if ((ctx->hflags & 0x80000) == 0) {
      gen_pool32axf_nanomips_insn_cold_42();
    }
    uVar16 = ctx->opcode >> 0xc & 3;
    if (uVar16 == 1) {
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,(ulong)(uVar9 >> 3));
      pTVar1 = s->cpu_env;
      pcVar13 = helper_shilo_mips64el;
    }
    else {
      if (uVar16 != 0) {
        generate_exception_err(ctx,0x14,0);
        break;
      }
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,(ulong)uVar9);
      pTVar1 = s->cpu_env;
      pcVar13 = helper_mthlip_mips64el;
    }
    local_58 = (TCGTemp *)(pTVar1 + (long)s);
    local_60 = (TCGTemp *)((long)s + (long)pTVar11);
    local_68 = (TCGTemp *)((long)s + (long)pTVar6);
    tcg_gen_callN_mips64el(s,pcVar13,(TCGTemp *)0x0,3,&local_68);
    break;
  default:
    generate_exception_err(ctx,0x14,0);
    break;
  case 3:
    if ((ctx->hflags & 0x80000) == 0) {
      gen_pool32axf_nanomips_insn_cold_41();
    }
    uVar16 = ctx->opcode >> 0xe & 0x7f;
    switch(ctx->opcode >> 0xc & 3) {
    case 0:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,(ulong)uVar16);
      local_60 = (TCGTemp *)(s->cpu_env + (long)s);
      local_68 = (TCGTemp *)((long)s + (long)pTVar6);
      tcg_gen_callN_mips64el(s,helper_rddsp_mips64el,local_68,2,&local_68);
      if (to == 0) goto LAB_0099ce38;
      pTVar17 = s->cpu_gpr[to];
      goto LAB_0099cca6;
    case 1:
      if (to == 0) {
        TVar12 = INDEX_op_movi_i64;
        pTVar17 = (TCGv_i64)0x0;
LAB_0099d4f0:
        tcg_gen_op2_mips64el(s,TVar12,(TCGArg)pTVar4,(TCGArg)pTVar17);
      }
      else if (s->cpu_gpr[to] != pTVar6) {
        pTVar17 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[to]);
        TVar12 = INDEX_op_mov_i64;
        goto LAB_0099d4f0;
      }
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar5,(ulong)uVar16);
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      local_68 = (TCGTemp *)((long)s + (long)pTVar6);
      local_60 = (TCGTemp *)((long)s + (long)pTVar8);
      tcg_gen_callN_mips64el(s,helper_wrdsp_mips64el,(TCGTemp *)0x0,3,&local_68);
      goto LAB_0099ce38;
    case 2:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,(ulong)(uVar9 >> 3));
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar5,a2);
      pTVar1 = s->cpu_env;
      pcVar13 = helper_extp_mips64el;
      break;
    case 3:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,(ulong)(uVar9 >> 3));
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar5,a2);
      pTVar1 = s->cpu_env;
      pcVar13 = helper_extpdp_mips64el;
    }
    local_58 = (TCGTemp *)(pTVar1 + (long)s);
    local_60 = (TCGTemp *)((long)s + (long)pTVar8);
    local_68 = (TCGTemp *)((long)s + (long)pTVar6);
    tcg_gen_callN_mips64el(s,pcVar13,local_68,3,&local_68);
    goto joined_r0x0099cc95;
  case 4:
    if ((ctx->hflags & 0x80000) == 0) {
      gen_pool32axf_nanomips_insn_cold_40();
    }
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,(ulong)(uVar9 >> 2));
    if ((ctx->opcode & 0x1000) == 0) {
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar13 = helper_shll_qb_mips64el;
      iVar7 = 3;
    }
    else {
      pcVar13 = helper_shrl_qb_mips64el;
      iVar7 = 2;
    }
    local_60 = (TCGTemp *)((long)s + (long)pTVar11);
    local_68 = (TCGTemp *)((long)s + (long)pTVar6);
    tcg_gen_callN_mips64el(s,pcVar13,local_68,iVar7,&local_68);
    if (to == 0) break;
    goto LAB_0099cc9e;
  case 5:
    uVar16 = ctx->opcode >> 0xc & 3;
    s_00 = ctx->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_internal_mips64el(s_00,TCG_TYPE_I32,false);
    pTVar5 = tcg_temp_new_internal_mips64el(s_00,TCG_TYPE_I64,false);
    pTVar17 = (TCGv_i64)((long)pTVar5 - (long)s_00);
    pTVar3 = tcg_temp_new_internal_mips64el(s_00,TCG_TYPE_I64,false);
    tcg_gen_op2_mips64el(s_00,INDEX_op_movi_i32,(TCGArg)pTVar4,(ulong)(uVar9 >> 3));
    if (to == 0) {
      TVar12 = INDEX_op_movi_i64;
      pTVar15 = (TCGv_i64)0x0;
LAB_0099c64e:
      tcg_gen_op2_mips64el(s_00,TVar12,(TCGArg)pTVar5,(TCGArg)pTVar15);
    }
    else if (s_00->cpu_gpr[to] != pTVar17) {
      pTVar15 = (TCGv_i64)((long)&s_00->pool_cur + (long)s_00->cpu_gpr[to]);
      TVar12 = INDEX_op_mov_i64;
      goto LAB_0099c64e;
    }
    pTVar15 = (TCGv_i64)((long)pTVar3 - (long)s_00);
    if (from == 0) {
      tcg_gen_op2_mips64el(s_00,INDEX_op_movi_i64,(TCGArg)pTVar3,0);
      switch(uVar16) {
      case 1:
        goto switchD_0099c6a0_caseD_1;
      case 2:
        goto switchD_0099c6a0_caseD_2;
      case 3:
        goto switchD_0099c6a0_caseD_3;
      }
switchD_0099c6a0_caseD_0:
      if ((ctx->hflags & 0x80000) == 0) {
        gen_pool32axf_nanomips_insn_cold_39();
      }
      local_50 = s_00->cpu_env + (long)s_00;
      pcVar13 = helper_maq_s_w_phr_mips64el;
    }
    else {
      if (s_00->cpu_gpr[a2] != pTVar15) {
        tcg_gen_op2_mips64el
                  (s_00,INDEX_op_mov_i64,(TCGArg)pTVar3,
                   (TCGArg)((long)&s_00->pool_cur + (long)s_00->cpu_gpr[a2]));
      }
      switch(uVar16) {
      case 0:
        goto switchD_0099c6a0_caseD_0;
      case 1:
switchD_0099c6a0_caseD_1:
        if ((ctx->hflags & 0x80000) == 0) {
          gen_pool32axf_nanomips_insn_cold_38();
        }
        local_50 = s_00->cpu_env + (long)s_00;
        pcVar13 = helper_maq_s_w_phl_mips64el;
        break;
      case 2:
switchD_0099c6a0_caseD_2:
        if ((ctx->hflags & 0x80000) == 0) {
          gen_pool32axf_nanomips_insn_cold_37();
        }
        local_50 = s_00->cpu_env + (long)s_00;
        pcVar13 = helper_maq_sa_w_phr_mips64el;
        break;
      case 3:
switchD_0099c6a0_caseD_3:
        if ((ctx->hflags & 0x80000) == 0) {
          gen_pool32axf_nanomips_insn_cold_36();
        }
        local_50 = s_00->cpu_env + (long)s_00;
        pcVar13 = helper_maq_sa_w_phl_mips64el;
      }
    }
    local_58 = (TCGTemp *)((long)s_00 + (long)pTVar17);
    local_60 = (TCGTemp *)((long)s_00 + (long)pTVar15);
    local_68 = (TCGTemp *)(((long)pTVar4 - (long)s_00) + (long)s_00);
    tcg_gen_callN_mips64el(s_00,pcVar13,(TCGTemp *)0x0,4,&local_68);
    tcg_temp_free_internal_mips64el(s_00,(TCGTemp *)(((long)pTVar4 - (long)s_00) + (long)s_00));
    tcg_temp_free_internal_mips64el(s_00,(TCGTemp *)(pTVar17 + (long)s_00));
    tcg_temp_free_internal_mips64el(s_00,(TCGTemp *)(pTVar15 + (long)s_00));
    break;
  case 7:
    if ((ctx->hflags & 0x80000) == 0) {
      gen_pool32axf_nanomips_insn_cold_35();
    }
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,(ulong)(uVar9 >> 3));
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar5,a2);
    switch(ctx->opcode >> 0xc & 3) {
    case 0:
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar13 = helper_extr_w_mips64el;
      break;
    case 1:
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar13 = helper_extr_r_w_mips64el;
      break;
    case 2:
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar13 = helper_extr_rs_w_mips64el;
      break;
    case 3:
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar13 = helper_extr_s_h_mips64el;
    }
    local_60 = (TCGTemp *)((long)s + (long)pTVar8);
    local_68 = (TCGTemp *)((long)s + (long)pTVar6);
    tcg_gen_callN_mips64el(s,pcVar13,local_68,3,&local_68);
joined_r0x0099cc95:
    if (to != 0) {
LAB_0099cc9e:
      pTVar17 = s->cpu_gpr[to];
LAB_0099cca6:
      if (pTVar17 != pTVar6) {
        tcg_gen_op2_mips64el
                  (s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)pTVar17),(TCGArg)pTVar4);
      }
    }
  }
LAB_0099ce38:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar6 + (long)s));
LAB_0099ce4f:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar8 + (long)s));
LAB_0099ce5a:
  pTVar4 = (TCGTemp *)(pTVar11 + (long)s);
LAB_0099daa4:
  tcg_temp_free_internal_mips64el(s,pTVar4);
  return;
}

Assistant:

static void gen_pool32axf_nanomips_insn(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rt = extract32(ctx->opcode, 21, 5);
    int rs = extract32(ctx->opcode, 16, 5);
    int rd = extract32(ctx->opcode, 11, 5);

    switch (extract32(ctx->opcode, 6, 3)) {
    case NM_POOL32AXF_1:
        {
            int32_t op1 = extract32(ctx->opcode, 9, 3);
            gen_pool32axf_1_nanomips_insn(ctx, op1, rt, rs, rd);
        }
        break;
    case NM_POOL32AXF_2:
        {
            int32_t op1 = extract32(ctx->opcode, 12, 2);
            gen_pool32axf_2_nanomips_insn(ctx, op1, rt, rs, rd);
        }
        break;
    case NM_POOL32AXF_4:
        {
            int32_t op1 = extract32(ctx->opcode, 9, 7);
            gen_pool32axf_4_nanomips_insn(ctx, op1, rt, rs);
        }
        break;
    case NM_POOL32AXF_5:
        switch (extract32(ctx->opcode, 9, 7)) {
        case NM_TLBP:
            gen_cp0(env, ctx, OPC_TLBP, 0, 0);
            break;
        case NM_TLBR:
            gen_cp0(env, ctx, OPC_TLBR, 0, 0);
            break;
        case NM_TLBWI:
            gen_cp0(env, ctx, OPC_TLBWI, 0, 0);
            break;
        case NM_TLBWR:
            gen_cp0(env, ctx, OPC_TLBWR, 0, 0);
            break;
        case NM_TLBINV:
            gen_cp0(env, ctx, OPC_TLBINV, 0, 0);
            break;
        case NM_TLBINVF:
            gen_cp0(env, ctx, OPC_TLBINVF, 0, 0);
            break;
        case NM_DI:
            check_cp0_enabled(ctx);
            {
                TCGv t0 = tcg_temp_new(tcg_ctx);

                save_cpu_state(ctx, 1);
                gen_helper_di(tcg_ctx, t0, tcg_ctx->cpu_env);
                gen_store_gpr(tcg_ctx, t0, rt);
            /* Stop translation as we may have switched the execution mode */
                ctx->base.is_jmp = DISAS_STOP;
                tcg_temp_free(tcg_ctx, t0);
            }
            break;
        case NM_EI:
            check_cp0_enabled(ctx);
            {
                TCGv t0 = tcg_temp_new(tcg_ctx);

                save_cpu_state(ctx, 1);
                gen_helper_ei(tcg_ctx, t0, tcg_ctx->cpu_env);
                gen_store_gpr(tcg_ctx, t0, rt);
            /* Stop translation as we may have switched the execution mode */
                ctx->base.is_jmp = DISAS_STOP;
                tcg_temp_free(tcg_ctx, t0);
            }
            break;
        case NM_RDPGPR:
            gen_load_srsgpr(tcg_ctx, rs, rt);
            break;
        case NM_WRPGPR:
            gen_store_srsgpr(tcg_ctx, rs, rt);
            break;
        case NM_WAIT:
            gen_cp0(env, ctx, OPC_WAIT, 0, 0);
            break;
        case NM_DERET:
            gen_cp0(env, ctx, OPC_DERET, 0, 0);
            break;
        case NM_ERETX:
            gen_cp0(env, ctx, OPC_ERET, 0, 0);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case NM_POOL32AXF_7:
        {
            int32_t op1 = extract32(ctx->opcode, 9, 3);
            gen_pool32axf_7_nanomips_insn(ctx, op1, rt, rs, rd);
        }
        break;
    default:
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}